

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

Violation __thiscall
mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::
ComputeViolation<mp::VarInfoRecomp>
          (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *this,VarInfoRecomp *x,
          bool logical)

{
  Violation VVar1;
  bool bVar2;
  double *pdVar3;
  byte in_DL;
  QuadAndLinTerms *in_RDI;
  longdouble in_ST0;
  double dVar4;
  double dVar5;
  double bd;
  double in_stack_ffffffffffffff98;
  AlgConRhs<_1> *in_stack_ffffffffffffffa0;
  VarInfoRecomp *in_stack_ffffffffffffffa8;
  double local_40;
  double local_38;
  double local_30;
  byte local_21;
  double local_10;
  double local_8;
  
  local_21 = in_DL & 1;
  QuadAndLinTerms::ComputeValue<mp::VarInfoRecomp>(in_RDI,in_stack_ffffffffffffffa8);
  local_30 = (double)in_ST0;
  if ((local_21 & 1) == 0) {
    dVar4 = AlgConRhs<-1>::lb((AlgConRhs<_1> *)
                              &in_RDI[1].super_LinTerms.coefs_.
                               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.
                               m_data[1].__align);
    if (dVar4 <= local_30) {
      dVar4 = local_30;
      dVar5 = AlgConRhs<-1>::ub((AlgConRhs<_1> *)0x26fad8);
      if (dVar4 <= dVar5) {
        local_38 = AlgConRhs<-1>::lb((AlgConRhs<_1> *)
                                     &in_RDI[1].super_LinTerms.coefs_.
                                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                      m_storage.m_data[1].__align);
        local_38 = local_38 - local_30;
        dVar4 = local_30;
        local_40 = AlgConRhs<-1>::ub((AlgConRhs<_1> *)0x26fb6c);
        local_40 = dVar4 - local_40;
        pdVar3 = std::max<double>(&local_38,&local_40);
        local_10 = *pdVar3;
        local_8 = 0.0;
      }
      else {
        dVar4 = local_30;
        local_10 = AlgConRhs<-1>::ub((AlgConRhs<_1> *)0x26fb04);
        local_10 = dVar4 - local_10;
        local_8 = AlgConRhs<-1>::ub((AlgConRhs<_1> *)0x26fb28);
      }
    }
    else {
      local_10 = AlgConRhs<-1>::lb((AlgConRhs<_1> *)
                                   &in_RDI[1].super_LinTerms.coefs_.
                                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                    m_storage.m_data[1].__align);
      local_10 = local_10 - local_30;
      local_8 = AlgConRhs<-1>::lb((AlgConRhs<_1> *)
                                  &in_RDI[1].super_LinTerms.coefs_.
                                   super_small_vector_base<std::allocator<double>,_6U>.m_data.
                                   m_storage.m_data[1].__align);
    }
  }
  else {
    bVar2 = AlgConRhs<-1>::is_valid(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_10 = (double)!bVar2;
    local_8 = 1.0;
  }
  VVar1.valX_ = local_8;
  VVar1.viol_ = local_10;
  return VVar1;
}

Assistant:

Violation
  ComputeViolation(const VarInfo& x, bool logical=false) const {
    double bd = Body::ComputeValue(x);
    if (!logical) {
      if (RhsOrRange::lb() > bd)
        return {RhsOrRange::lb() - bd, RhsOrRange::lb()};
      if (bd > RhsOrRange::ub())
        return {bd - RhsOrRange::ub(), RhsOrRange::ub()};
      return
      {std::max( // negative. Same for strict cmp?
                 RhsOrRange::lb() - bd, bd - RhsOrRange::ub()),
            0.0};
    }
    return {double(!RhsOrRange::is_valid(bd)), 1.0};
  }